

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O2

double __thiscall tri_cc_geom_t::get_vert_area(tri_cc_geom_t *this,cellid_t c)

{
  long lVar1;
  uint uVar2;
  ostream *poVar3;
  runtime_error *this_00;
  ulong uVar4;
  double dVar5;
  double dVar6;
  string local_1d8 [32];
  cellid_t st [40];
  
  uVar2 = get_cell_dim(this,c);
  if (uVar2 == 0) {
    uVar2 = get_vert_star(this,c,st);
    dVar5 = 0.0;
    for (uVar4 = 1; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      lVar1 = *(long *)&this->m_cell_pos;
      dVar6 = la::tri_area<double,3u>
                        ((type *)((long)st[uVar4 - 1] * 0x18 + lVar1),
                         (type *)(lVar1 + (long)c * 0x18),(type *)((long)st[uVar4] * 0x18 + lVar1));
      dVar5 = dVar5 + dVar6;
    }
    return dVar5;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)st);
  poVar3 = std::operator<<((ostream *)(st + 4),"Failed to assert condition ");
  poVar3 = std::operator<<(poVar3,"get_cell_dim(c) == 0");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"at (");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.cpp"
                          );
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = std::operator<<(poVar3,"get_vert_area");
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x289);
  std::operator<<(poVar3,") \n ");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1d8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double tri_cc_geom_t::get_vert_area(cellid_t c) const
{
  ASSERT(get_cell_dim(c) == 0);

  double area = 0;

  cellid_t st[40];

  uint st_ct = get_vert_star(c,st);

  for(uint i = 1; i < st_ct; i++)
    area += la::tri_area<double,3>
        (m_cell_pos[st[i-1]],m_cell_pos[c],m_cell_pos[st[i]]);

  return area;
}